

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Subprocess::Communicate
          (Subprocess *this,Message *input,Message *output,string *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  uint uVar6;
  LogMessage *pLVar7;
  __sighandler_t __handler;
  int *piVar8;
  ssize_t sVar9;
  char *pcVar10;
  size_t sVar11;
  bool bVar12;
  int __fd;
  int iVar13;
  int status;
  string output_data;
  string local_12c8;
  string input_data;
  fd_set read_fds;
  fd_set write_fds;
  SubstituteArg local_1188;
  SubstituteArg local_1158;
  SubstituteArg local_1128;
  SubstituteArg local_10f8;
  SubstituteArg local_10c8;
  SubstituteArg local_1098;
  SubstituteArg local_1068;
  char buffer [4096];
  
  if (this->child_stdin_ == -1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)buffer,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
               ,0x15e);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)buffer,"CHECK failed: (child_stdin_) != (-1): ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"Must call Start() first.");
    internal::LogFinisher::operator=((LogFinisher *)&read_fds,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)buffer);
  }
  __handler = signal(0xd,(__sighandler_t)0x1);
  MessageLite::SerializeAsString_abi_cxx11_(&input_data,&input->super_MessageLite);
  output_data._M_dataplus._M_p = (pointer)&output_data.field_2;
  output_data._M_string_length = 0;
  output_data.field_2._M_local_buf[0] = '\0';
  __fd = this->child_stdin_;
  iVar3 = this->child_stdout_;
  if (iVar3 != -1) {
    if (__fd <= iVar3) {
      __fd = iVar3;
    }
    iVar13 = 0;
    do {
      read_fds.fds_bits[0] = 0;
      read_fds.fds_bits[1] = 0;
      read_fds.fds_bits[2] = 0;
      read_fds.fds_bits[3] = 0;
      read_fds.fds_bits[4] = 0;
      read_fds.fds_bits[5] = 0;
      read_fds.fds_bits[6] = 0;
      read_fds.fds_bits[7] = 0;
      read_fds.fds_bits[8] = 0;
      read_fds.fds_bits[9] = 0;
      read_fds.fds_bits[10] = 0;
      read_fds.fds_bits[0xb] = 0;
      read_fds.fds_bits[0xc] = 0;
      read_fds.fds_bits[0xd] = 0;
      read_fds.fds_bits[0xe] = 0;
      read_fds.fds_bits[0xf] = 0;
      write_fds.fds_bits[0] = 0;
      write_fds.fds_bits[1] = 0;
      write_fds.fds_bits[2] = 0;
      write_fds.fds_bits[3] = 0;
      write_fds.fds_bits[4] = 0;
      write_fds.fds_bits[5] = 0;
      write_fds.fds_bits[6] = 0;
      write_fds.fds_bits[7] = 0;
      write_fds.fds_bits[8] = 0;
      write_fds.fds_bits[9] = 0;
      write_fds.fds_bits[10] = 0;
      write_fds.fds_bits[0xb] = 0;
      iVar2 = iVar3 + 0x3f;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      read_fds.fds_bits[iVar2 >> 6] = read_fds.fds_bits[iVar2 >> 6] | 1L << ((byte)iVar3 & 0x3f);
      write_fds.fds_bits[0xc] = 0;
      write_fds.fds_bits[0xd] = 0;
      write_fds.fds_bits[0xe] = 0;
      write_fds.fds_bits[0xf] = 0;
      iVar3 = this->child_stdin_;
      if (iVar3 != -1) {
        iVar2 = iVar3 + 0x3f;
        if (-1 < iVar3) {
          iVar2 = iVar3;
        }
        write_fds.fds_bits[iVar2 >> 6] =
             write_fds.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
      }
      iVar3 = select(__fd + 1,(fd_set *)&read_fds,(fd_set *)&write_fds,(fd_set *)0x0,(timeval *)0x0)
      ;
      if (iVar3 < 0) {
        piVar8 = __errno_location();
        if (*piVar8 != 4) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)buffer,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
                     ,0x17d);
          pLVar7 = internal::LogMessage::operator<<((LogMessage *)buffer,"select: ");
          pcVar10 = strerror(*piVar8);
          pLVar7 = internal::LogMessage::operator<<(pLVar7,pcVar10);
          internal::LogFinisher::operator=((LogFinisher *)&local_1188,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)buffer);
          goto LAB_001860a6;
        }
      }
      else {
LAB_001860a6:
        uVar6 = this->child_stdin_;
        if (uVar6 != 0xffffffff) {
          uVar4 = uVar6 + 0x3f;
          if (-1 < (int)uVar6) {
            uVar4 = uVar6;
          }
          if (((ulong)write_fds.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            sVar9 = write(uVar6,input_data._M_dataplus._M_p + iVar13,
                          input_data._M_string_length - (long)iVar13);
            iVar3 = (int)input_data._M_string_length;
            if (-1 < (int)sVar9) {
              iVar3 = iVar13 + (int)sVar9;
            }
            iVar13 = iVar3;
            if (input_data._M_string_length == (long)iVar13) {
              close(this->child_stdin_);
              this->child_stdin_ = -1;
            }
          }
        }
        uVar6 = this->child_stdout_;
        if (uVar6 == 0xffffffff) break;
        uVar4 = uVar6 + 0x3f;
        if (-1 < (int)uVar6) {
          uVar4 = uVar6;
        }
        if (((ulong)read_fds.fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
          sVar9 = read(uVar6,(LogMessage *)buffer,0x1000);
          if ((int)sVar9 < 1) {
            close(this->child_stdout_);
            this->child_stdout_ = -1;
          }
          else {
            std::__cxx11::string::append((char *)&output_data,(ulong)buffer);
          }
        }
      }
      iVar3 = this->child_stdout_;
    } while (iVar3 != -1);
    __fd = this->child_stdin_;
  }
  if (__fd != -1) {
    close(__fd);
    this->child_stdin_ = -1;
  }
  while (_Var5 = waitpid(this->child_pid_,&status,0), _Var5 == -1) {
    piVar8 = __errno_location();
    if (*piVar8 != 4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)buffer,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
                 ,0x1ab);
      pLVar7 = internal::LogMessage::operator<<((LogMessage *)buffer,"waitpid: ");
      pcVar10 = strerror(*piVar8);
      pLVar7 = internal::LogMessage::operator<<(pLVar7,pcVar10);
      internal::LogFinisher::operator=((LogFinisher *)&read_fds,pLVar7);
      internal::LogMessage::~LogMessage((LogMessage *)buffer);
    }
  }
  signal(0xd,__handler);
  uVar6 = status & 0x7f;
  if (uVar6 == 0) {
    uVar6 = (uint)status >> 8 & 0xff;
    if (uVar6 == 0) {
      bVar1 = MessageLite::ParseFromString(&output->super_MessageLite,&output_data);
      bVar12 = true;
      if (bVar1) goto LAB_0018645e;
      pcVar10 = "Plugin output is unparseable.";
      goto LAB_0018644d;
    }
    buffer._0_8_ = FastInt32ToBuffer(uVar6,buffer + 0xc);
    sVar11 = strlen((char *)buffer._0_8_);
    buffer._8_4_ = (undefined4)sVar11;
    read_fds.fds_bits[0] = 0;
    read_fds.fds_bits[1] = CONCAT44(read_fds.fds_bits[1]._4_4_,0xffffffff);
    write_fds.fds_bits[0] = 0;
    write_fds.fds_bits[1] = CONCAT44(write_fds.fds_bits[1]._4_4_,0xffffffff);
    local_1188.text_ = (char *)0x0;
    local_1188.size_ = -1;
    local_1068.text_ = (char *)0x0;
    local_1068.size_ = -1;
    local_1098.text_ = (char *)0x0;
    local_1098.size_ = -1;
    local_10c8.text_ = (char *)0x0;
    local_10c8.size_ = -1;
    local_10f8.text_ = (char *)0x0;
    local_10f8.size_ = -1;
    local_1128.text_ = (char *)0x0;
    local_1128.size_ = -1;
    local_1158.text_ = (char *)0x0;
    local_1158.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_12c8,(strings *)"Plugin failed with status code $0.",buffer,
               (SubstituteArg *)&read_fds,(SubstituteArg *)&write_fds,&local_1188,&local_1068,
               &local_1098,&local_10c8,&local_10f8,&local_1128,&local_1158,(SubstituteArg *)error);
  }
  else {
    if ((int)(uVar6 * 0x1000000 + 0x1000000) < 0x2000000) {
      pcVar10 = "Neither WEXITSTATUS nor WTERMSIG is true?";
LAB_0018644d:
      bVar12 = false;
      std::__cxx11::string::_M_replace
                ((ulong)error,0,*(char **)&((SubstituteArg *)error)->size_,(ulong)pcVar10);
      goto LAB_0018645e;
    }
    buffer._0_8_ = FastInt32ToBuffer(uVar6,buffer + 0xc);
    sVar11 = strlen((char *)buffer._0_8_);
    buffer._8_4_ = (undefined4)sVar11;
    read_fds.fds_bits[0] = 0;
    read_fds.fds_bits[1] = CONCAT44(read_fds.fds_bits[1]._4_4_,0xffffffff);
    write_fds.fds_bits[0] = 0;
    write_fds.fds_bits[1] = CONCAT44(write_fds.fds_bits[1]._4_4_,0xffffffff);
    local_1188.text_ = (char *)0x0;
    local_1188.size_ = -1;
    local_1068.text_ = (char *)0x0;
    local_1068.size_ = -1;
    local_1098.text_ = (char *)0x0;
    local_1098.size_ = -1;
    local_10c8.text_ = (char *)0x0;
    local_10c8.size_ = -1;
    local_10f8.text_ = (char *)0x0;
    local_10f8.size_ = -1;
    local_1128.text_ = (char *)0x0;
    local_1128.size_ = -1;
    local_1158.text_ = (char *)0x0;
    local_1158.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_12c8,(strings *)"Plugin killed by signal $0.",buffer,
               (SubstituteArg *)&read_fds,(SubstituteArg *)&write_fds,&local_1188,&local_1068,
               &local_1098,&local_10c8,&local_10f8,&local_1128,&local_1158,(SubstituteArg *)error);
  }
  std::__cxx11::string::operator=((string *)error,(string *)&local_12c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
    operator_delete(local_12c8._M_dataplus._M_p,local_12c8.field_2._M_allocated_capacity + 1);
  }
  bVar12 = false;
LAB_0018645e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output_data._M_dataplus._M_p != &output_data.field_2) {
    operator_delete(output_data._M_dataplus._M_p,
                    CONCAT71(output_data.field_2._M_allocated_capacity._1_7_,
                             output_data.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input_data._M_dataplus._M_p != &input_data.field_2) {
    operator_delete(input_data._M_dataplus._M_p,input_data.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

bool Subprocess::Communicate(const Message& input, Message* output,
                             string* error) {

  GOOGLE_CHECK_NE(child_stdin_, -1) << "Must call Start() first.";

  // The "sighandler_t" typedef is GNU-specific, so define our own.
  typedef void SignalHandler(int);

  // Make sure SIGPIPE is disabled so that if the child dies it doesn't kill us.
  SignalHandler* old_pipe_handler = signal(SIGPIPE, SIG_IGN);

  string input_data = input.SerializeAsString();
  string output_data;

  int input_pos = 0;
  int max_fd = max(child_stdin_, child_stdout_);

  while (child_stdout_ != -1) {
    fd_set read_fds;
    fd_set write_fds;
    FD_ZERO(&read_fds);
    FD_ZERO(&write_fds);
    if (child_stdout_ != -1) {
      FD_SET(child_stdout_, &read_fds);
    }
    if (child_stdin_ != -1) {
      FD_SET(child_stdin_, &write_fds);
    }

    if (select(max_fd + 1, &read_fds, &write_fds, NULL, NULL) < 0) {
      if (errno == EINTR) {
        // Interrupted by signal.  Try again.
        continue;
      } else {
        GOOGLE_LOG(FATAL) << "select: " << strerror(errno);
      }
    }

    if (child_stdin_ != -1 && FD_ISSET(child_stdin_, &write_fds)) {
      int n = write(child_stdin_, input_data.data() + input_pos,
                                  input_data.size() - input_pos);
      if (n < 0) {
        // Child closed pipe.  Presumably it will report an error later.
        // Pretend we're done for now.
        input_pos = input_data.size();
      } else {
        input_pos += n;
      }

      if (input_pos == input_data.size()) {
        // We're done writing.  Close.
        close(child_stdin_);
        child_stdin_ = -1;
      }
    }

    if (child_stdout_ != -1 && FD_ISSET(child_stdout_, &read_fds)) {
      char buffer[4096];
      int n = read(child_stdout_, buffer, sizeof(buffer));

      if (n > 0) {
        output_data.append(buffer, n);
      } else {
        // We're done reading.  Close.
        close(child_stdout_);
        child_stdout_ = -1;
      }
    }
  }

  if (child_stdin_ != -1) {
    // Child did not finish reading input before it closed the output.
    // Presumably it exited with an error.
    close(child_stdin_);
    child_stdin_ = -1;
  }

  int status;
  while (waitpid(child_pid_, &status, 0) == -1) {
    if (errno != EINTR) {
      GOOGLE_LOG(FATAL) << "waitpid: " << strerror(errno);
    }
  }

  // Restore SIGPIPE handling.
  signal(SIGPIPE, old_pipe_handler);

  if (WIFEXITED(status)) {
    if (WEXITSTATUS(status) != 0) {
      int error_code = WEXITSTATUS(status);
      *error = strings::Substitute(
          "Plugin failed with status code $0.", error_code);
      return false;
    }
  } else if (WIFSIGNALED(status)) {
    int signal = WTERMSIG(status);
    *error = strings::Substitute(
        "Plugin killed by signal $0.", signal);
    return false;
  } else {
    *error = "Neither WEXITSTATUS nor WTERMSIG is true?";
    return false;
  }

  if (!output->ParseFromString(output_data)) {
    *error = "Plugin output is unparseable.";
    return false;
  }

  return true;
}